

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> * __thiscall
kratos::GeneratorGraph::get_nodes
          (vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *__return_storage_ptr__
          ,GeneratorGraph *this)

{
  __node_base *p_Var1;
  
  (__return_storage_ptr__->
  super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::reserve
            (__return_storage_ptr__,(this->nodes_)._M_h._M_element_count);
  p_Var1 = &(this->nodes_)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    std::vector<kratos::Generator*,std::allocator<kratos::Generator*>>::
    emplace_back<kratos::Generator*const&>
              ((vector<kratos::Generator*,std::allocator<kratos::Generator*>> *)
               __return_storage_ptr__,(Generator **)(p_Var1 + 3));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Generator *> GeneratorGraph::get_nodes() {
    std::vector<Generator *> res;
    res.reserve(nodes_.size());
    for (auto const &iter : nodes_) {
        res.emplace_back(iter.second.generator);
    }

    return res;
}